

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O3

cmValue cmTargetPropertyComputer::GetLocation<cmGeneratorTarget>
                  (cmGeneratorTarget *tgt,string *prop,cmMakefile *mf)

{
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  pointer __s1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string configName;
  string local_50;
  
  TVar3 = cmTarget::GetType(tgt->Target);
  if ((((TVar3 != EXECUTABLE) && (TVar3 = cmTarget::GetType(tgt->Target), TVar3 != STATIC_LIBRARY))
      && (TVar3 = cmTarget::GetType(tgt->Target), TVar3 != SHARED_LIBRARY)) &&
     ((TVar3 = cmTarget::GetType(tgt->Target), TVar3 != MODULE_LIBRARY &&
      (TVar3 = cmTarget::GetType(tgt->Target), TVar3 != UNKNOWN_LIBRARY)))) {
    return (cmValue)(string *)0x0;
  }
  if (GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
      ::propLOCATION_abi_cxx11_ == '\0') {
    GetLocation<cmGeneratorTarget>();
  }
  pcVar1 = (pointer)prop->_M_string_length;
  if (pcVar1 == (pointer)GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                         ::propLOCATION_abi_cxx11_._M_string_length) {
    if (pcVar1 != (pointer)0x0) {
      __s1 = (prop->_M_dataplus)._M_p;
      iVar4 = bcmp(__s1,GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                        ::propLOCATION_abi_cxx11_._M_dataplus._M_p,(size_t)pcVar1);
      if (iVar4 != 0) goto LAB_004cab17;
    }
    bVar2 = cmTarget::IsImported(tgt->Target);
    if (!bVar2) {
      psVar5 = cmTarget::GetName_abi_cxx11_(tgt->Target);
      bVar2 = HandleLocationPropertyPolicy(psVar5,mf);
      if (!bVar2) {
        return (cmValue)(string *)0x0;
      }
    }
    ComputeLocationForBuild<cmGeneratorTarget>(tgt);
  }
  else {
    __s1 = (prop->_M_dataplus)._M_p;
LAB_004cab17:
    __str._M_str = "LOCATION_";
    __str._M_len = 9;
    local_50._M_dataplus._M_p = pcVar1;
    local_50._M_string_length = (size_type)__s1;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,9,__str);
    if (iVar4 != 0) {
      local_50._M_string_length = (size_type)(prop->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)prop->_M_string_length;
      if (local_50._M_dataplus._M_p < (pointer)0x9) {
        return (cmValue)(string *)0x0;
      }
      __str_00._M_str = "_LOCATION";
      __str_00._M_len = 9;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,
                         (size_type)(local_50._M_dataplus._M_p + -9),9,__str_00);
      if (iVar4 != 0) {
        return (cmValue)(string *)0x0;
      }
      local_50._M_string_length = (size_type)(prop->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)prop->_M_string_length;
      __str_01._M_str = "XCODE_ATTRIBUTE_";
      __str_01._M_len = 0x10;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,0x10,
                         __str_01);
      if (iVar4 == 0) {
        return (cmValue)(string *)0x0;
      }
      pcVar1 = (prop->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,pcVar1 + (prop->_M_string_length - 9));
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      psVar5 = (string *)tgt;
      if (iVar4 != 0) {
        bVar2 = cmTarget::IsImported(tgt->Target);
        if (!bVar2) {
          psVar5 = cmTarget::GetName_abi_cxx11_(tgt->Target);
          bVar2 = HandleLocationPropertyPolicy(psVar5,mf);
          if (!bVar2) {
            psVar5 = (string *)0x0;
            goto LAB_004caca4;
          }
        }
        cmGeneratorTarget::GetLocation(tgt,&local_50);
        psVar5 = &cmGeneratorTarget::GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_;
      }
LAB_004caca4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        return (cmValue)(string *)0x0;
      }
      return (cmValue)psVar5;
    }
    bVar2 = cmTarget::IsImported(tgt->Target);
    if (!bVar2) {
      psVar5 = cmTarget::GetName_abi_cxx11_(tgt->Target);
      bVar2 = HandleLocationPropertyPolicy(psVar5,mf);
      if (!bVar2) {
        return (cmValue)(string *)0x0;
      }
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
    cmGeneratorTarget::GetLocation(tgt,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmValue)&cmGeneratorTarget::GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_;
}

Assistant:

static cmValue GetLocation(Target const* tgt, std::string const& prop,
                             cmMakefile const& mf)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        return cmValue(ComputeLocationForBuild(tgt));
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return cmValue(ComputeLocation(tgt, configName));
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
            return nullptr;
          }
          return cmValue(ComputeLocation(tgt, configName));
        }
      }
    }
    return nullptr;
  }